

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

Value * __thiscall ccd::Json::Value::operator[](Value *this,int key)

{
  string *this_00;
  vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *this_01;
  const_reference pvVar1;
  allocator<char> local_15;
  int local_14;
  Value *pVStack_10;
  int key_local;
  Value *this_local;
  
  local_14 = key;
  pVStack_10 = this;
  if (this->m_type != Array) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,"Item is no Array",&local_15);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this_01 = std::
            get<std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                      (&this->m_value);
  pvVar1 = std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::operator[]
                     (this_01,(long)local_14);
  return pvVar1;
}

Assistant:

const Value& Value::operator[] ( const int key ) const
{
	if ( m_type != Type::Array )
		throw std::string ( "Item is no Array" );
	return std::get<Array>(m_value)[key];
}